

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9_result_value(jx9_context *pCtx,jx9_value *pValue)

{
  sxi32 sVar1;
  
  if (pValue != (jx9_value *)0x0) {
    sVar1 = jx9MemObjStore(pValue,pCtx->pRet);
    return sVar1;
  }
  jx9MemObjRelease(pCtx->pRet);
  return 0;
}

Assistant:

JX9_PRIVATE int jx9_result_value(jx9_context *pCtx, jx9_value *pValue)
{
	int rc = JX9_OK;
	if( pValue == 0 ){
		jx9MemObjRelease(pCtx->pRet);
	}else{
		rc = jx9MemObjStore(pValue, pCtx->pRet);
	}
	return rc;
}